

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_vars.cc
# Opt level: O0

void tcmalloc::Static::InitStaticVars(void)

{
  bool aggressive_decommit_00;
  uint uVar1;
  PageHeap *pPVar2;
  Length smallest_span_size;
  char *value;
  uint local_c;
  bool aggressive_decommit;
  bool kDefaultAggressiveDecommit;
  int i;
  
  SizeMap::Init((SizeMap *)sizemap_);
  PageHeapAllocator<tcmalloc::Span>::Init((PageHeapAllocator<tcmalloc::Span> *)span_allocator_);
  PageHeapAllocator<tcmalloc::Span>::New((PageHeapAllocator<tcmalloc::Span> *)span_allocator_);
  PageHeapAllocator<tcmalloc::Span>::New((PageHeapAllocator<tcmalloc::Span> *)span_allocator_);
  PageHeapAllocator<tcmalloc::StackTrace>::Init
            ((PageHeapAllocator<tcmalloc::StackTrace> *)stacktrace_allocator_);
  local_c = 0;
  while( true ) {
    uVar1 = num_size_classes();
    if (uVar1 <= local_c) break;
    CentralFreeList::Init
              ((CentralFreeList *)(central_cache_ + (long)(int)local_c * 0x4c0),(long)(int)local_c);
    local_c = local_c + 1;
  }
  pPVar2 = pageheap();
  smallest_span_size = SizeMap::min_span_size_in_pages((SizeMap *)sizemap_);
  PageHeap::PageHeap(pPVar2,smallest_span_size);
  value = TCMallocGetenvSafe("TCMALLOC_AGGRESSIVE_DECOMMIT");
  aggressive_decommit_00 = commandlineflags::StringToBool(value,false);
  pPVar2 = pageheap();
  PageHeap::SetAggressiveDecommit(pPVar2,aggressive_decommit_00);
  inited_ = 1;
  DLL_Init((Span *)sampled_objects_);
  return;
}

Assistant:

void Static::InitStaticVars() {
  sizemap_.Init();
  span_allocator_.Init();
  span_allocator_.New(); // Reduce cache conflicts
  span_allocator_.New(); // Reduce cache conflicts
  stacktrace_allocator_.Init();

  for (int i = 0; i < num_size_classes(); ++i) {
    central_cache_[i].Init(i);
  }

  new (pageheap()) PageHeap(sizemap_.min_span_size_in_pages());

#if defined(ENABLE_AGGRESSIVE_DECOMMIT_BY_DEFAULT)
  const bool kDefaultAggressiveDecommit = true;
#else
  const bool kDefaultAggressiveDecommit = false;
#endif


  bool aggressive_decommit =
    tcmalloc::commandlineflags::StringToBool(
      TCMallocGetenvSafe("TCMALLOC_AGGRESSIVE_DECOMMIT"),
                         kDefaultAggressiveDecommit);

  pageheap()->SetAggressiveDecommit(aggressive_decommit);

  inited_ = true;

  DLL_Init(&sampled_objects_);
}